

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_mem.c
# Opt level: O3

void * custom_realloc(void *ptr,size_t size)

{
  void *pvVar1;
  
  if (ptr == (void *)0x0) {
    if (size != 0) {
      pvVar1 = calloc(1,size);
      return pvVar1;
    }
  }
  else {
    if (size != 0) {
      pvVar1 = realloc(ptr,size);
      return pvVar1;
    }
    free(ptr);
  }
  return (void *)0x0;
}

Assistant:

static void *custom_realloc(void *ptr, size_t size) {
	if (!ptr) {
		if (!size)
			return NULL;
		return calloc(1, size);
	}
	if (size)
		return realloc(ptr, size);
	free(ptr);
	return NULL;
}